

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O2

void __thiscall QSqlResult::QSqlResult(QSqlResult *this,QSqlResultPrivate *dd)

{
  bool bVar1;
  NumericalPrecisionPolicy NVar2;
  undefined8 extraout_RDX;
  
  this->_vptr_QSqlResult = (_func_int **)&PTR__QSqlResult_0014d3d8;
  this->d_ptr = dd;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&dd->sqldriver);
  if (bVar1) {
    NVar2 = QSqlDriver::numericalPrecisionPolicy((QSqlDriver *)(dd->sqldriver).wp.value);
    (*this->_vptr_QSqlResult[0x1d])(this,(ulong)NVar2,extraout_RDX,this->_vptr_QSqlResult[0x1d]);
    return;
  }
  return;
}

Assistant:

QSqlResult::QSqlResult(QSqlResultPrivate &dd)
    : d_ptr(&dd)
{
    Q_D(QSqlResult);
    if (d->sqldriver)
        setNumericalPrecisionPolicy(d->sqldriver->numericalPrecisionPolicy());
}